

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint-c.cpp
# Opt level: O3

double duckdb_decimal_to_double(duckdb_decimal val)

{
  hugeint_t input;
  double result;
  CastParameters parameters;
  uint8_t in_stack_ffffffffffffffb8;
  double local_40;
  double local_38;
  undefined1 local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined1 local_10;
  
  local_38 = 0.0;
  local_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0xffffffffffffffff;
  local_10 = 0;
  input.upper = (int64_t)&local_40;
  input.lower = parameters._8_8_;
  duckdb::TryCastFromDecimal::Operation<duckdb::hugeint_t,double>
            ((TryCastFromDecimal *)parameters.cast_data.ptr,input,&local_38,
             (CastParameters *)(ulong)result._0_1_,result._1_1_,in_stack_ffffffffffffffb8);
  return local_40;
}

Assistant:

double duckdb_decimal_to_double(duckdb_decimal val) {
	double result;
	hugeint_t value;
	value.lower = val.value.lower;
	value.upper = val.value.upper;
	duckdb::CastParameters parameters;
	duckdb::TryCastFromDecimal::Operation<hugeint_t, double>(value, result, parameters, val.width, val.scale);
	return result;
}